

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O0

void __thiscall SecureDataManager::encrypt(SecureDataManager *this,char *__block,int __edflag)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  ByteString finalBlock;
  ByteString IV;
  MutexLocker lock;
  ByteString unmaskedKey;
  AESKey theKey;
  ByteString *in_stack_fffffffffffffe78;
  ByteString *in;
  SecureDataManager *in_stack_fffffffffffffe80;
  ByteString *this_00;
  undefined4 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8d;
  undefined1 in_stack_fffffffffffffe8e;
  byte bVar5;
  undefined1 in_stack_fffffffffffffe8f;
  ByteString *in_stack_fffffffffffffe90;
  SymmetricAlgorithm *pSVar6;
  undefined7 in_stack_fffffffffffffe98;
  ByteString *this_01;
  ByteString local_120;
  undefined1 local_f8 [44];
  undefined4 local_cc;
  undefined1 local_c8 [112];
  undefined1 local_58 [56];
  undefined8 local_20;
  char *local_18;
  SecureDataManager *local_10;
  undefined1 local_1;
  ByteString *lhs;
  
  local_20 = CONCAT44(in_register_00000014,__edflag);
  if ((((this->userLoggedIn & 1U) != 0) || ((this->soLoggedIn & 1U) != 0)) &&
     (local_18 = __block, local_10 = this, sVar4 = ByteString::size((ByteString *)0x1c99bb),
     sVar4 == 0x20)) {
    AESKey::AESKey((AESKey *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    ByteString::ByteString((ByteString *)0x1c99ed);
    MutexLocker::MutexLocker
              ((MutexLocker *)in_stack_fffffffffffffe80,(Mutex *)in_stack_fffffffffffffe78);
    unmask(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    SymmetricKey::setKeyBits
              ((SymmetricKey *)
               CONCAT17(in_stack_fffffffffffffe8f,
                        CONCAT16(in_stack_fffffffffffffe8e,
                                 CONCAT15(in_stack_fffffffffffffe8d,
                                          CONCAT14(in_stack_fffffffffffffe8c,
                                                   in_stack_fffffffffffffe88)))),
               (ByteString *)in_stack_fffffffffffffe80);
    remask(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    MutexLocker::~MutexLocker((MutexLocker *)in_stack_fffffffffffffe80);
    ByteString::wipe(in_stack_fffffffffffffe90,
                     CONCAT17(in_stack_fffffffffffffe8f,
                              CONCAT16(in_stack_fffffffffffffe8e,
                                       CONCAT15(in_stack_fffffffffffffe8d,
                                                CONCAT14(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88)))));
    ByteString::ByteString((ByteString *)0x1c9a76);
    this_01 = (ByteString *)this->rng;
    iVar2 = (*this->aes->_vptr_SymmetricAlgorithm[0xd])();
    lhs = (ByteString *)CONCAT44(extraout_var,iVar2);
    uVar3 = (*this_01->_vptr_ByteString[2])(this_01,local_c8,lhs);
    uVar1 = (undefined1)uVar3;
    if ((uVar3 & 1) == 0) {
      local_1 = 0;
      local_cc = 1;
    }
    else {
      ByteString::ByteString((ByteString *)0x1c9b65);
      pSVar6 = this->aes;
      ByteString::ByteString((ByteString *)0x1c9b82);
      in = &local_120;
      this_00 = (ByteString *)0x0;
      uVar3 = (*pSVar6->_vptr_SymmetricAlgorithm[2])(pSVar6,local_58,1,local_c8,1,0);
      bVar5 = 1;
      if ((uVar3 & 1) != 0) {
        uVar3 = (*this->aes->_vptr_SymmetricAlgorithm[3])(this->aes,local_18,local_20);
        bVar5 = 1;
        if ((uVar3 & 1) != 0) {
          iVar2 = (*this->aes->_vptr_SymmetricAlgorithm[4])(this->aes,local_f8);
          bVar5 = (byte)iVar2 ^ 0xff;
        }
      }
      uVar3 = (uint)bVar5 << 0x18;
      ByteString::~ByteString((ByteString *)0x1c9c55);
      local_1 = (uVar3 & 0x1000000) == 0;
      if ((bool)local_1) {
        ByteString::operator+=(this_01,(ByteString *)CONCAT17(uVar1,in_stack_fffffffffffffe98));
        operator+(lhs,this_01);
        ByteString::operator=(this_00,in);
        ByteString::~ByteString((ByteString *)0x1c9d04);
      }
      local_cc = 1;
      ByteString::~ByteString((ByteString *)0x1c9d46);
    }
    ByteString::~ByteString((ByteString *)0x1c9d64);
    ByteString::~ByteString((ByteString *)0x1c9d71);
    AESKey::~AESKey((AESKey *)0x1c9d7e);
  }
  return;
}

Assistant:

bool SecureDataManager::encrypt(const ByteString& plaintext, ByteString& encrypted)
{
	// Check the object logged in state
	if ((!userLoggedIn && !soLoggedIn) || (maskedKey.size() != 32))
	{
		return false;
	}

	AESKey theKey(256);
	ByteString unmaskedKey;

	{
		MutexLocker lock(dataMgrMutex);

		unmask(unmaskedKey);

		theKey.setKeyBits(unmaskedKey);

		remask(unmaskedKey);
	}

	// Wipe encrypted data block
	encrypted.wipe();

	// Generate random IV
	ByteString IV;

	if (!rng->generateRandom(IV, aes->getBlockSize())) return false;

	ByteString finalBlock;

	if (!aes->encryptInit(&theKey, SymMode::CBC, IV) ||
	    !aes->encryptUpdate(plaintext, encrypted) ||
	    !aes->encryptFinal(finalBlock))
	{
		return false;
	}

	encrypted += finalBlock;

	// Add IV to output data
	encrypted = IV + encrypted;

	return true;
}